

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  ImVec2 IVar1;
  bool bVar2;
  long lVar3;
  ImVec2 *pIVar4;
  uint uVar5;
  uint uVar6;
  ImVec2 *pIVar7;
  ImVec2 *pIVar8;
  ImDrawIdx IVar9;
  ImDrawIdx IVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  undefined8 uStack_2c0;
  ImVec2 aIStack_2b8 [4];
  float local_298;
  float local_294;
  ImVec2 *local_290;
  ImVec2 *local_288;
  ImVec2 *local_280;
  ImVec2 *local_278;
  ImVec2 *local_270;
  ImVec2 *local_268;
  ImVec2 *local_260;
  float local_254;
  ImVec2 *local_250;
  ImVec2 *local_248;
  float local_240;
  float local_23c;
  ImVec2 *local_238;
  ImVec2 *local_230;
  ImVec2 *local_228;
  float local_21c;
  ImVec2 *local_218;
  float local_20c;
  uint local_208;
  int local_204;
  ImDrawList *local_200;
  float local_1f8;
  float local_1f4;
  float dy;
  float dx;
  ImVec2 diff_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1d0;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_1;
  ImVec2 local_1a0;
  ImVec2 dm_in;
  ImVec2 dm_out;
  float scale_1;
  float dmr2_1;
  ImVec2 local_180;
  ImVec2 dm_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  float local_e8;
  int local_e4;
  float half_inner_thickness;
  int i;
  ImVec2 local_d8;
  float local_d0;
  float local_cc;
  float scale;
  float dmr2;
  ImVec2 local_c0;
  ImVec2 dm;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 diff;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  int count;
  ImVec2 uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    AA_SIZE = (float)points_count;
    if (!closed) {
      AA_SIZE = (float)(points_count + -1);
    }
    bVar2 = 1.0 < thickness;
    local_200 = this;
    if ((this->Flags & 1U) == 0) {
      uStack_2c0 = 0x200876;
      PrimReserve(this,(int)AA_SIZE * 6,(int)AA_SIZE << 2);
      for (local_1d0 = 0; local_1d0 < (int)AA_SIZE; local_1d0 = local_1d0 + 1) {
        if (local_1d0 + 1 == points_count) {
          aIStack_2b8[0].y = 0.0;
        }
        else {
          aIStack_2b8[0].y = (float)(local_1d0 + 1);
        }
        pIVar7 = points + local_1d0;
        diff_1 = (ImVec2)(points + (int)aIStack_2b8[0].y);
        uStack_2c0 = 0x200901;
        _dy = ::operator-((ImVec2 *)diff_1,pIVar7);
        uStack_2c0 = 0x20091d;
        fVar13 = ImInvLength((ImVec2 *)&dy,1.0);
        uStack_2c0 = 0x200929;
        operator*=((ImVec2 *)&dy,fVar13);
        local_1f4 = dy * thickness * 0.5;
        local_1f8 = dx * thickness * 0.5;
        (local_200->_VtxWritePtr->pos).x = pIVar7->x + local_1f8;
        (local_200->_VtxWritePtr->pos).y = pIVar7->y - local_1f4;
        local_200->_VtxWritePtr->uv = IVar1;
        local_200->_VtxWritePtr->col = col;
        local_200->_VtxWritePtr[1].pos.x = *(float *)diff_1 + local_1f8;
        local_200->_VtxWritePtr[1].pos.y = *(float *)((long)diff_1 + 4) - local_1f4;
        local_200->_VtxWritePtr[1].uv = IVar1;
        local_200->_VtxWritePtr[1].col = col;
        local_200->_VtxWritePtr[2].pos.x = *(float *)diff_1 - local_1f8;
        local_200->_VtxWritePtr[2].pos.y = *(float *)((long)diff_1 + 4) + local_1f4;
        local_200->_VtxWritePtr[2].uv = IVar1;
        local_200->_VtxWritePtr[2].col = col;
        local_200->_VtxWritePtr[3].pos.x = pIVar7->x - local_1f8;
        local_200->_VtxWritePtr[3].pos.y = pIVar7->y + local_1f4;
        local_200->_VtxWritePtr[3].uv = IVar1;
        local_200->_VtxWritePtr[3].col = col;
        local_200->_VtxWritePtr = local_200->_VtxWritePtr + 4;
        *local_200->_IdxWritePtr = (ImDrawIdx)local_200->_VtxCurrentIdx;
        local_200->_IdxWritePtr[1] = (short)local_200->_VtxCurrentIdx + 1;
        local_200->_IdxWritePtr[2] = (short)local_200->_VtxCurrentIdx + 2;
        local_200->_IdxWritePtr[3] = (ImDrawIdx)local_200->_VtxCurrentIdx;
        local_200->_IdxWritePtr[4] = (short)local_200->_VtxCurrentIdx + 2;
        local_200->_IdxWritePtr[5] = (short)local_200->_VtxCurrentIdx + 3;
        local_200->_IdxWritePtr = local_200->_IdxWritePtr + 6;
        local_200->_VtxCurrentIdx = local_200->_VtxCurrentIdx + 4;
      }
    }
    else {
      uVar6 = col & 0xffffff;
      if (bVar2) {
        local_204 = (int)AA_SIZE * 0x12;
        local_208 = points_count << 2;
      }
      else {
        local_204 = (int)AA_SIZE * 0xc;
        local_208 = points_count * 3;
      }
      uVar5 = local_208;
      uStack_2c0 = 0x1ff8c8;
      PrimReserve(this,local_204,local_208);
      lVar3 = -((long)(int)(points_count * ((uint)bVar2 * 2 + 3)) * 8 + 0xfU & 0xfffffffffffffff0);
      pIVar7 = (ImVec2 *)((long)aIStack_2b8 + lVar3);
      pIVar8 = pIVar7 + points_count;
      for (diff.y = 0.0; (int)diff.y < (int)AA_SIZE; diff.y = (float)((int)diff.y + 1)) {
        if ((int)diff.y + 1 == points_count) {
          local_20c = 0.0;
        }
        else {
          local_20c = (float)((int)diff.y + 1);
        }
        diff.x = local_20c;
        lVar11 = (long)(int)local_20c;
        lVar12 = (long)(int)diff.y;
        *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ff95f;
        local_68 = ::operator-(points + lVar11,points + lVar12);
        *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ff975;
        fVar13 = ImInvLength(&local_68,1.0);
        *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ff97e;
        operator*=(&local_68,fVar13);
        pIVar7[(int)diff.y].x = local_68.y;
        *(float *)((long)aIStack_2b8 + (long)(int)diff.y * 8 + lVar3 + 4) = -local_68.x;
      }
      if (!closed) {
        pIVar7[points_count + -1] = pIVar7[points_count + -2];
      }
      if (bVar2) {
        local_e8 = (thickness - 1.0) * 0.5;
        if (!closed) {
          local_254 = 1.0;
          fVar13 = local_e8 + 1.0;
          local_290 = points;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1fffc6;
          local_f8 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_290;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1fffe1;
          local_f0 = operator+(pIVar4,&local_f8);
          *pIVar8 = local_f0;
          fVar13 = local_e8;
          local_288 = points;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200013;
          local_108 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_288;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20002e;
          local_100 = operator+(pIVar4,&local_108);
          pIVar8[1] = local_100;
          fVar13 = local_e8;
          local_280 = points;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200061;
          local_118 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_280;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20007c;
          local_110 = ::operator-(pIVar4,&local_118);
          fVar13 = local_254;
          pIVar8[2] = local_110;
          fVar13 = local_e8 + fVar13;
          local_278 = points;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x2000bb;
          local_128 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_278;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x2000d6;
          local_120 = ::operator-(pIVar4,&local_128);
          fVar13 = local_254;
          pIVar8[3] = local_120;
          local_270 = points + (points_count + -1);
          fVar13 = local_e8 + fVar13;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200125;
          local_138 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_270;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200140;
          IVar14 = operator+(pIVar4,&local_138);
          fVar13 = local_e8;
          pIVar8[points_count * 4 + -4] = IVar14;
          local_268 = points + (points_count + -1);
          local_130 = IVar14;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200192;
          local_148 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_268;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x2001ad;
          IVar14 = operator+(pIVar4,&local_148);
          fVar13 = local_e8;
          pIVar8[(long)(points_count * 4 + -4) + 1] = IVar14;
          local_260 = points + (points_count + -1);
          local_140 = IVar14;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200200;
          local_158 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_260;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20021b;
          IVar14 = ::operator-(pIVar4,&local_158);
          pIVar8[(long)(points_count * 4 + -4) + 2] = IVar14;
          local_250 = points + (points_count + -1);
          fVar13 = local_e8 + local_254;
          local_150 = IVar14;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20027a;
          _i1_2 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_250;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200295;
          IVar14 = ::operator-(pIVar4,(ImVec2 *)&i1_2);
          pIVar8[(points_count + -1) * 4 + 3] = IVar14;
          local_160 = IVar14;
        }
        i2_2 = local_200->_VtxCurrentIdx;
        for (idx2_1 = 0; (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            local_294 = 0.0;
          }
          else {
            local_294 = (float)(idx2_1 + 1);
          }
          dm_1.y = local_294;
          if (idx2_1 + 1 == points_count) {
            local_298 = (float)local_200->_VtxCurrentIdx;
          }
          else {
            local_298 = (float)(i2_2 + 4);
          }
          dm_1.x = local_298;
          lVar11 = (long)(int)local_294;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200371;
          _scale_1 = operator+(pIVar7 + (int)idx2_1,pIVar7 + lVar11);
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20038d;
          local_180 = ::operator*((ImVec2 *)&scale_1,0.5);
          fVar13 = local_180.x * local_180.x + local_180.y * local_180.y;
          if (1e-06 < fVar13) {
            dm_out.x = 1.0 / fVar13;
            if (100.0 < dm_out.x) {
              dm_out.x = 100.0;
            }
            *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20042b;
            operator*=(&local_180,dm_out.x);
          }
          fVar13 = local_e8 + 1.0;
          aIStack_2b8[1] = (ImVec2)&local_180;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200452;
          dm_in = ::operator*(&local_180,fVar13);
          fVar13 = local_e8;
          IVar14 = aIStack_2b8[1];
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20046e;
          local_1a0 = ::operator*((ImVec2 *)IVar14,fVar13);
          lVar11 = (long)(int)dm_1.y;
          aIStack_2b8[3] = (ImVec2)&dm_in;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x200498;
          IVar14 = operator+(points + lVar11,&dm_in);
          pIVar8[(int)dm_1.y << 2] = IVar14;
          lVar11 = (long)(int)dm_1.y;
          aIStack_2b8[2] = (ImVec2)&local_1a0;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x2004dd;
          IVar15 = operator+(points + lVar11,&local_1a0);
          IVar14 = aIStack_2b8[2];
          pIVar8[(long)((int)dm_1.y << 2) + 1] = IVar15;
          lVar11 = (long)(int)dm_1.y;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20051c;
          IVar15 = ::operator-(points + lVar11,(ImVec2 *)IVar14);
          IVar14 = aIStack_2b8[3];
          pIVar8[(long)((int)dm_1.y << 2) + 2] = IVar15;
          lVar11 = (long)(int)dm_1.y;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x20055b;
          IVar14 = ::operator-(points + lVar11,(ImVec2 *)IVar14);
          pIVar8[(int)dm_1.y * 4 + 3] = IVar14;
          IVar9 = SUB42(dm_1.x,0);
          *local_200->_IdxWritePtr = IVar9 + 1;
          IVar10 = (ImDrawIdx)i2_2;
          local_200->_IdxWritePtr[1] = IVar10 + 1;
          local_200->_IdxWritePtr[2] = IVar10 + 2;
          local_200->_IdxWritePtr[3] = IVar10 + 2;
          local_200->_IdxWritePtr[4] = IVar9 + 2;
          local_200->_IdxWritePtr[5] = IVar9 + 1;
          local_200->_IdxWritePtr[6] = IVar9 + 1;
          local_200->_IdxWritePtr[7] = IVar10 + 1;
          local_200->_IdxWritePtr[8] = IVar10;
          local_200->_IdxWritePtr[9] = IVar10;
          local_200->_IdxWritePtr[10] = IVar9;
          local_200->_IdxWritePtr[0xb] = IVar9 + 1;
          local_200->_IdxWritePtr[0xc] = IVar9 + 2;
          local_200->_IdxWritePtr[0xd] = IVar10 + 2;
          local_200->_IdxWritePtr[0xe] = IVar10 + 3;
          local_200->_IdxWritePtr[0xf] = IVar10 + 3;
          local_200->_IdxWritePtr[0x10] = IVar9 + 3;
          local_200->_IdxWritePtr[0x11] = IVar9 + 2;
          local_200->_IdxWritePtr = local_200->_IdxWritePtr + 0x12;
          i2_2 = (int)dm_1.x;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          local_200->_VtxWritePtr->pos = pIVar8[vtx_count_1 << 2];
          local_200->_VtxWritePtr->uv = IVar1;
          local_200->_VtxWritePtr->col = uVar6;
          local_200->_VtxWritePtr[1].pos = pIVar8[vtx_count_1 * 4 + 1];
          local_200->_VtxWritePtr[1].uv = IVar1;
          local_200->_VtxWritePtr[1].col = col;
          local_200->_VtxWritePtr[2].pos = pIVar8[vtx_count_1 * 4 + 2];
          local_200->_VtxWritePtr[2].uv = IVar1;
          local_200->_VtxWritePtr[2].col = col;
          local_200->_VtxWritePtr[3].pos = pIVar8[vtx_count_1 * 4 + 3];
          local_200->_VtxWritePtr[3].uv = IVar1;
          local_200->_VtxWritePtr[3].col = uVar6;
          local_200->_VtxWritePtr = local_200->_VtxWritePtr + 4;
        }
      }
      else {
        if (!closed) {
          local_21c = 1.0;
          local_238 = points;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffa1e;
          local_78 = ::operator*(pIVar7,1.0);
          pIVar4 = local_238;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffa33;
          local_70 = operator+(pIVar4,&local_78);
          fVar13 = local_21c;
          *pIVar8 = local_70;
          local_230 = points;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffa62;
          local_88 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_230;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffa77;
          local_80 = ::operator-(pIVar4,&local_88);
          fVar13 = local_21c;
          pIVar8[1] = local_80;
          local_228 = points + (points_count + -1);
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffab7;
          local_98 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_228;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffad2;
          IVar14 = operator+(pIVar4,&local_98);
          fVar13 = local_21c;
          pIVar8[points_count * 2 + -2] = IVar14;
          local_218 = points + (points_count + -1);
          local_90 = IVar14;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffb24;
          _i1_1 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_218;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffb3f;
          IVar14 = ::operator-(pIVar4,(ImVec2 *)&i1_1);
          pIVar8[(points_count + -1) * 2 + 1] = IVar14;
          local_a0 = IVar14;
        }
        i2_1 = local_200->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_23c = 0.0;
          }
          else {
            local_23c = (float)(idx2 + 1);
          }
          dm.y = local_23c;
          if (idx2 + 1 == points_count) {
            local_240 = (float)local_200->_VtxCurrentIdx;
          }
          else {
            local_240 = (float)(i2_1 + 3);
          }
          dm.x = local_240;
          lVar11 = (long)(int)local_23c;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffc1a;
          _scale = operator+(pIVar7 + (int)idx2,pIVar7 + lVar11);
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffc36;
          local_c0 = ::operator*((ImVec2 *)&scale,0.5);
          local_cc = local_c0.x * local_c0.x + local_c0.y * local_c0.y;
          if (1e-06 < local_cc) {
            local_d0 = 1.0 / local_cc;
            if (100.0 < local_d0) {
              local_d0 = 100.0;
            }
            fVar13 = local_d0;
            *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffcd4;
            operator*=(&local_c0,fVar13);
          }
          local_248 = &local_c0;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffcef;
          operator*=(&local_c0,1.0);
          pIVar4 = local_248;
          lVar11 = (long)(int)dm.y;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffd0a;
          IVar14 = operator+(points + lVar11,pIVar4);
          pIVar4 = local_248;
          pIVar8[(int)dm.y * 2] = IVar14;
          lVar11 = (long)(int)dm.y;
          local_d8 = IVar14;
          *(undefined8 *)((long)aIStack_2b8 + lVar3 + -8) = 0x1ffd47;
          IVar14 = ::operator-(points + lVar11,pIVar4);
          pIVar8[(int)dm.y * 2 + 1] = IVar14;
          IVar9 = SUB42(dm.x,0);
          *local_200->_IdxWritePtr = IVar9;
          IVar10 = (ImDrawIdx)i2_1;
          local_200->_IdxWritePtr[1] = IVar10;
          local_200->_IdxWritePtr[2] = IVar10 + 2;
          local_200->_IdxWritePtr[3] = IVar10 + 2;
          local_200->_IdxWritePtr[4] = IVar9 + 2;
          local_200->_IdxWritePtr[5] = IVar9;
          local_200->_IdxWritePtr[6] = IVar9 + 1;
          local_200->_IdxWritePtr[7] = IVar10 + 1;
          local_200->_IdxWritePtr[8] = IVar10;
          local_200->_IdxWritePtr[9] = IVar10;
          local_200->_IdxWritePtr[10] = IVar9;
          local_200->_IdxWritePtr[0xb] = IVar9 + 1;
          local_200->_IdxWritePtr = local_200->_IdxWritePtr + 0xc;
          i2_1 = (int)dm.x;
          _half_inner_thickness = IVar14;
        }
        for (local_e4 = 0; local_e4 < points_count; local_e4 = local_e4 + 1) {
          local_200->_VtxWritePtr->pos = points[local_e4];
          local_200->_VtxWritePtr->uv = IVar1;
          local_200->_VtxWritePtr->col = col;
          local_200->_VtxWritePtr[1].pos = pIVar8[local_e4 << 1];
          local_200->_VtxWritePtr[1].uv = IVar1;
          local_200->_VtxWritePtr[1].col = uVar6;
          local_200->_VtxWritePtr[2].pos = pIVar8[local_e4 * 2 + 1];
          local_200->_VtxWritePtr[2].uv = IVar1;
          local_200->_VtxWritePtr[2].col = uVar6;
          local_200->_VtxWritePtr = local_200->_VtxWritePtr + 3;
        }
      }
      local_200->_VtxCurrentIdx = (uVar5 & 0xffff) + local_200->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            ImVec2 diff = points[i2] - points[i1];
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i1].x = diff.y;
            temp_normals[i1].y = -diff.x;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                dm *= AA_SIZE;
                temp_points[i2*2+0] = points[i2] + dm;
                temp_points[i2*2+1] = points[i2] - dm;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                ImVec2 dm_out = dm * (half_inner_thickness + AA_SIZE);
                ImVec2 dm_in = dm * half_inner_thickness;
                temp_points[i2*4+0] = points[i2] + dm_out;
                temp_points[i2*4+1] = points[i2] + dm_in;
                temp_points[i2*4+2] = points[i2] - dm_in;
                temp_points[i2*4+3] = points[i2] - dm_out;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];
            ImVec2 diff = p2 - p1;
            diff *= ImInvLength(diff, 1.0f);

            const float dx = diff.x * (thickness * 0.5f);
            const float dy = diff.y * (thickness * 0.5f);
            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}